

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeResolveLabel(Vdbe *v,int x)

{
  Parse *pPVar1;
  int *piVar2;
  long lVar3;
  
  pPVar1 = v->pParse;
  if (-1 < pPVar1->nLabel + pPVar1->nLabelAlloc) {
    pPVar1->aLabel[~x] = v->nOp;
    return;
  }
  lVar3 = 10 - (long)pPVar1->nLabel;
  piVar2 = (int *)sqlite3DbReallocOrFree(pPVar1->db,pPVar1->aLabel,lVar3 * 4);
  pPVar1->aLabel = piVar2;
  if (piVar2 == (int *)0x0) {
    pPVar1->nLabelAlloc = 0;
  }
  else {
    pPVar1->nLabelAlloc = (int)lVar3;
    piVar2[~x] = v->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeResolveLabel(Vdbe *v, int x){
  Parse *p = v->pParse;
  int j = ADDR(x);
  assert( v->eVdbeState==VDBE_INIT_STATE );
  assert( j<-p->nLabel );
  assert( j>=0 );
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    printf("RESOLVE LABEL %d to %d\n", x, v->nOp);
  }
#endif
  if( p->nLabelAlloc + p->nLabel < 0 ){
    resizeResolveLabel(p,v,j);
  }else{
    assert( p->aLabel[j]==(-1) ); /* Labels may only be resolved once */
    p->aLabel[j] = v->nOp;
  }
}